

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simulation.cpp
# Opt level: O0

void __thiscall Simulation::renderFrame(Simulation *this)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar1;
  Simulation *this_local;
  
  handleInputs(this);
  setCameraDir(this);
  if (Config::dim == 2) {
    pvVar1 = Fluids::texture(&this->_fluid);
    Renderer::initTexture2D(&this->_renderer,pvVar1,(this->_fluidRenderer).material.texture);
    updateMeshVec(this);
    updateMeshGrid(this);
    updateMeshGridBorder(this);
  }
  else if (Config::dim == 3) {
    pvVar1 = Fluids::texture(&this->_fluid);
    Renderer::initTexture3D(&this->_renderer,pvVar1,(this->_fluidRenderer).material.texture);
  }
  Renderer::prePass(&this->_renderer);
  Renderer::applyMaterial
            (&this->_renderer,&(this->_fluidRenderer).material,&this->_camera,
             &(this->_fluidRenderer).transform);
  Renderer::drawMesh(&this->_renderer,&(this->_fluidRenderer).mesh);
  if (Config::dim == 2) {
    Renderer::applyMaterial
              (&this->_renderer,&(this->_fluidRenderer).materialVec,&this->_camera,
               &(this->_fluidRenderer).transform);
    Renderer::drawMesh(&this->_renderer,&(this->_fluidRenderer).meshVec);
    Renderer::applyMaterial
              (&this->_renderer,&(this->_fluidRenderer).materialGrid,&this->_camera,
               &(this->_fluidRenderer).transform);
    Renderer::drawMesh(&this->_renderer,&(this->_fluidRenderer).meshGrid);
    Renderer::setLineWidth(&this->_renderer,2.0);
    Renderer::applyMaterial
              (&this->_renderer,&(this->_fluidRenderer).materialGridBorder,&this->_camera,
               &(this->_fluidRenderer).transform);
    Renderer::drawMesh(&this->_renderer,&(this->_fluidRenderer).meshGridBorder);
    Renderer::setLineWidth(&this->_renderer,1.0);
  }
  Renderer::endPass(&this->_renderer);
  if (Config::dim == 3) {
    Renderer::raymarchPass(&this->_renderer);
  }
  Window::swapBuffers(&this->_window);
  Window::pollEvents(&this->_window);
  return;
}

Assistant:

void Simulation::renderFrame()
{
    handleInputs();
    setCameraDir();
    if (Config::dim == 2)
    {
        _renderer.initTexture2D(_fluid.texture(),
                _fluidRenderer.material.texture);
        updateMeshVec();
        updateMeshGrid();
        updateMeshGridBorder();
    }
    else if (Config::dim == 3)
    {
        _renderer.initTexture3D(_fluid.texture(),
                _fluidRenderer.material.texture);
    }

    _renderer.prePass();
    _renderer.applyMaterial(_fluidRenderer.material,
            _camera, _fluidRenderer.transform);
    _renderer.drawMesh(_fluidRenderer.mesh);

    if (Config::dim == 2)
    {
        _renderer.applyMaterial(_fluidRenderer.materialVec,
                _camera, _fluidRenderer.transform);
        _renderer.drawMesh(_fluidRenderer.meshVec);

        _renderer.applyMaterial(_fluidRenderer.materialGrid,
                _camera, _fluidRenderer.transform);
        _renderer.drawMesh(_fluidRenderer.meshGrid);

        _renderer.setLineWidth(2);
        _renderer.applyMaterial(_fluidRenderer.materialGridBorder,
                _camera, _fluidRenderer.transform);
        _renderer.drawMesh(_fluidRenderer.meshGridBorder);
        _renderer.setLineWidth(1);
    }

    _renderer.endPass();
    if (Config::dim == 3)
    {
        _renderer.raymarchPass();
    }

    _window.swapBuffers();
    _window.pollEvents();
}